

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNode.h
# Opt level: O2

PtrTokenOrSyntax * __thiscall
slang::syntax::SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax>::getChildPtr
          (PtrTokenOrSyntax *__return_storage_ptr__,
          SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax> *this,size_t index)

{
  TokenOrSyntax *this_00;
  long lVar1;
  SyntaxNode *pSVar2;
  
  lVar1 = *(long *)((long)&__return_storage_ptr__[2].
                           super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                           super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
                           .
                           super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
                           .
                           super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
                           .
                           super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
                           .
                           super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
                           .
                           super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
                   + 8);
  this_00 = (TokenOrSyntax *)(lVar1 + (long)this * 0x18);
  if (*(char *)(lVar1 + 0x10 + (long)this * 0x18) == '\x01') {
    pSVar2 = TokenOrSyntax::node(this_00);
  }
  else {
    pSVar2 = (SyntaxNode *)
             std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                       ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)this_00
                       );
  }
  return (PtrTokenOrSyntax *)pSVar2;
}

Assistant:

PtrTokenOrSyntax getChildPtr(size_t index) final {
        if (elements[index].isNode())
            return elements[index].node();
        else
            return &(std::get<parsing::Token>(elements[index]));
    }